

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

Gia_Man_t * Gia_ManPerformLfMapping(Gia_Man_t *p,Jf_Par_t *pPars,int fNormalized)

{
  char *pcVar1;
  Gia_Man_t *pGVar2;
  float *pfVar3;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  
  if (pPars->pTimesArr != (float *)0x0) {
    __assert_fail("pPars->pTimesArr == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                  ,0x8c7,"Gia_Man_t *Gia_ManPerformLfMapping(Gia_Man_t *, Jf_Par_t *, int)");
  }
  if (pPars->pTimesReq == (float *)0x0) {
    if ((p->pManTime == (void *)0x0) || (fNormalized == 0)) {
      pGVar2 = Gia_ManDup(p);
    }
    else {
      pGVar2 = Gia_ManDupUnnormalize(p);
      if (pGVar2 == (Gia_Man_t *)0x0) {
        return (Gia_Man_t *)0x0;
      }
      Gia_ManTransferTiming(pGVar2,p);
      pfVar3 = Tim_ManGetArrTimes((Tim_Man_t *)pGVar2->pManTime);
      pPars->pTimesArr = pfVar3;
      pfVar3 = Tim_ManGetReqTimes((Tim_Man_t *)pGVar2->pManTime);
      pPars->pTimesReq = pfVar3;
    }
    p_00 = Lf_ManPerformMappingInt(pGVar2,pPars);
    if (p_00 != pGVar2) {
      if (p_00->pName != (char *)0x0) {
        free(p_00->pName);
        p_00->pName = (char *)0x0;
      }
      if (p_00->pSpec != (char *)0x0) {
        free(p_00->pSpec);
        p_00->pSpec = (char *)0x0;
      }
      pcVar1 = pGVar2->pName;
      if (pcVar1 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar4 = strlen(pcVar1);
        pcVar5 = (char *)malloc(sVar4 + 1);
        strcpy(pcVar5,pcVar1);
      }
      p_00->pName = pcVar5;
      pcVar1 = pGVar2->pSpec;
      if (pcVar1 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        sVar4 = strlen(pcVar1);
        pcVar5 = (char *)malloc(sVar4 + 1);
        strcpy(pcVar5,pcVar1);
      }
      p_00->pSpec = pcVar5;
      Gia_ManSetRegNum(p_00,pGVar2->nRegs);
      Gia_ManTransferTiming(p_00,pGVar2);
      Gia_ManStop(pGVar2);
    }
    pGVar2 = Gia_ManDupNormalize(p_00,0);
    Gia_ManTransferMapping(pGVar2,p_00);
    Gia_ManTransferTiming(pGVar2,p_00);
    Gia_ManStop(p_00);
    return pGVar2;
  }
  __assert_fail("pPars->pTimesReq == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                ,0x8c8,"Gia_Man_t *Gia_ManPerformLfMapping(Gia_Man_t *, Jf_Par_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManPerformLfMapping( Gia_Man_t * p, Jf_Par_t * pPars, int fNormalized )
{
    Gia_Man_t * pNew;
    // reconstruct GIA according to the hierarchy manager
    assert( pPars->pTimesArr == NULL );
    assert( pPars->pTimesReq == NULL );
    if ( p->pManTime )
    {
        if ( fNormalized )
        {
            pNew = Gia_ManDupUnnormalize( p );
            if ( pNew == NULL )
                return NULL;
            Gia_ManTransferTiming( pNew, p );
            p = pNew;
            // set arrival and required times
            pPars->pTimesArr = Tim_ManGetArrTimes( (Tim_Man_t *)p->pManTime );
            pPars->pTimesReq = Tim_ManGetReqTimes( (Tim_Man_t *)p->pManTime );
        }
        else
            p = Gia_ManDup( p );
    }
    else 
        p = Gia_ManDup( p );
    // perform mapping
    pNew = Lf_ManPerformMappingInt( p, pPars );
    if ( pNew != p )
    {
        // transfer name
        ABC_FREE( pNew->pName );
        ABC_FREE( pNew->pSpec );
        pNew->pName = Abc_UtilStrsav( p->pName );
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
        // return the original (unmodified by the mapper) timing manager
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
    }
    // normalize and transfer mapping
    pNew = Gia_ManDupNormalize( p = pNew, 0 );
    Gia_ManTransferMapping( pNew, p );
//    Gia_ManTransferPacking( pNew, p );
    Gia_ManTransferTiming( pNew, p );
    Gia_ManStop( p );
    return pNew;
}